

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<char16_t>::reallocateAndGrow
          (QArrayDataPointer<char16_t> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<char16_t> *old)

{
  long lVar1;
  bool bVar2;
  char16_t *pcVar3;
  QPodArrayOps<char16_t> *this_00;
  long in_RCX;
  long in_RDX;
  GrowthPosition in_ESI;
  QArrayDataPointer<char16_t> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<char16_t> dp;
  undefined4 in_stack_ffffffffffffff68;
  AllocationOption in_stack_ffffffffffffff6c;
  QArrayDataPointer<char16_t> *in_stack_ffffffffffffff70;
  QArrayDataPointer<char16_t> *in_stack_ffffffffffffff78;
  QArrayDataPointer<char16_t> *n_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n_00 = in_RDI;
  if ((((in_ESI != GrowsAtEnd) || (in_RCX != 0)) ||
      (bVar2 = needsDetach(in_stack_ffffffffffffff70), bVar2)) || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<char16_t> *)&DAT_aaaaaaaaaaaaaaaa,(qsizetype)n_00,in_ESI);
    if ((0 < in_RDX) &&
       (pcVar3 = data((QArrayDataPointer<char16_t> *)&stack0xffffffffffffffe0),
       pcVar3 == (char16_t *)0x0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        qBadAlloc();
      }
      goto LAB_005379a2;
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach(in_stack_ffffffffffffff70);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QPodArrayOps<char16_t> *)
                  operator->((QArrayDataPointer<char16_t> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<char16_t> *)0x5378b7);
        begin((QArrayDataPointer<char16_t> *)0x5378c6);
        QtPrivate::QPodArrayOps<char16_t>::copyAppend
                  (this_00,(char16_t *)in_stack_ffffffffffffff78,
                   (char16_t *)in_stack_ffffffffffffff70);
      }
      else {
        in_stack_ffffffffffffff70 =
             (QArrayDataPointer<char16_t> *)
             operator->((QArrayDataPointer<char16_t> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<char16_t> *)0x5378fe);
        begin((QArrayDataPointer<char16_t> *)0x53790d);
        QtPrivate::QPodArrayOps<char16_t>::moveAppend
                  ((QPodArrayOps<char16_t> *)in_stack_ffffffffffffff70,
                   (char16_t *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   L"ë譈⑼䠸璍砤ᗨ큞䣿粃堤琀䠏粋堤赈⑴\xe878巾￐赈⑼\xe878殄ￌ䡤ҋ⠥"
                  );
      }
    }
    swap(in_stack_ffffffffffffff70,
         (QArrayDataPointer<char16_t> *)
         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (in_RCX != 0) {
      swap(in_stack_ffffffffffffff70,
           (QArrayDataPointer<char16_t> *)
           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    ~QArrayDataPointer(in_stack_ffffffffffffff70);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity(in_stack_ffffffffffffff70);
    freeSpaceAtEnd(in_stack_ffffffffffffff78);
    QtPrivate::QPodArrayOps<char16_t>::reallocate
              ((QPodArrayOps<char16_t> *)in_stack_ffffffffffffff78,
               (qsizetype)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_005379a2:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }